

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
          (QAbstractGraphicsShapeItem *this,QGraphicsItem *parent)

{
  QAbstractGraphicsShapeItemPrivate *this_00;
  QGraphicsItem *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  
  this_00 = (QAbstractGraphicsShapeItemPrivate *)operator_new(0x1a8);
  QAbstractGraphicsShapeItemPrivate::QAbstractGraphicsShapeItemPrivate(this_00);
  QGraphicsItem::QGraphicsItem(in_RSI,in_RDI,(QGraphicsItem *)this_00);
  in_RDI->_vptr_QGraphicsItemPrivate = (_func_int **)&PTR__QAbstractGraphicsShapeItem_00d32630;
  return;
}

Assistant:

QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(QGraphicsItem *parent)
    : QGraphicsItem(*new QAbstractGraphicsShapeItemPrivate, parent)
{
}